

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O1

SPxId __thiscall
soplex::SPxDevexPR<double>::selectEnterDenseCoDim
          (SPxDevexPR<double> *this,double *best,double feastol,int start,int incr)

{
  double dVar1;
  SPxSolverBase<double> *this_00;
  pointer pdVar2;
  pointer pdVar3;
  SPxId SVar4;
  DataKey DVar5;
  ulong uVar6;
  int i;
  int iVar8;
  double dVar9;
  ulong uVar7;
  
  this_00 = (this->super_SPxPricer<double>).thesolver;
  pdVar2 = (this_00->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = 0xffffffff;
  i = -1;
  iVar8 = (int)((ulong)((long)(this_00->weights).val.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pdVar2) >> 3);
  if (start < iVar8) {
    pdVar3 = (this_00->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = (ulong)start;
    do {
      dVar1 = pdVar3[uVar6];
      if (dVar1 < -feastol) {
        dVar9 = feastol;
        if (feastol <= pdVar2[uVar6]) {
          dVar9 = pdVar2[uVar6];
        }
        dVar9 = (dVar1 * dVar1) / dVar9;
        if (*best <= dVar9 && dVar9 != *best) {
          *best = dVar9;
          this->last = pdVar2[uVar6];
          uVar7 = uVar6 & 0xffffffff;
        }
      }
      i = (int)uVar7;
      uVar6 = uVar6 + (long)incr;
    } while ((long)uVar6 < (long)iVar8);
  }
  if (-1 < i) {
    SVar4 = SPxSolverBase<double>::id(this_00,i);
    return (SPxId)SVar4.super_DataKey;
  }
  DVar5.info = 0;
  DVar5.idx = -1;
  return (SPxId)DVar5;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterDenseCoDim(R& best, R feastol, int start, int incr)
{
   const R* test = this->thesolver->test().get_const_ptr();
   const R* pen = this->thesolver->weights.get_const_ptr();
   int end = this->thesolver->weights.dim();
   int enterIdx = -1;
   R x;

   assert(end == this->thesolver->test().dim());

   for(; start < end; start += incr)
   {
      x = test[start];

      if(test[start] < -feastol)
      {
         x = devexpr::computePrice(x, pen[start], feastol);

         if(x > best)
         {
            best = x;
            enterIdx = start;
            last = pen[start];
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);

   return SPxId();
}